

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBufferHelper.cpp
# Opt level: O1

string * __thiscall
StringBufferHelper::GetNextSegmentBySeparator
          (string *__return_storage_ptr__,StringBufferHelper *this,string *separator)

{
  int iVar1;
  string currentBuffer;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  std::__cxx11::string::substr((ulong)local_40,(ulong)this);
  iVar1 = std::__cxx11::string::find((char *)local_40,(ulong)(separator->_M_dataplus)._M_p,0);
  if (iVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"NA","");
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_40);
    this->_currentPosition = this->_currentPosition + iVar1 + 1;
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string StringBufferHelper::GetNextSegmentBySeparator(std::string separator) {
    string currentBuffer = _buffer.substr(_currentPosition, _buffer.size());
    int position = currentBuffer.find(separator);

    if (position == string::npos) {
        return "NA";
    }

    string segment = currentBuffer.substr(0, position);
    _currentPosition = _currentPosition + (position + 1);

    return segment;
}